

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

int __thiscall HModel::util_convertBaseStatToWorking(HModel *this,int *cstat,int *rstat)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  if (this->numCol < 1) {
    iVar10 = 0;
  }
  else {
    piVar4 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    iVar10 = 0;
    do {
      if (cstat[uVar11] == 1) {
        piVar4[uVar11] = 0;
        piVar5[uVar11] = 0;
        piVar8[iVar10] = (int)uVar11;
        iVar10 = iVar10 + 1;
      }
      else {
        piVar4[uVar11] = 1;
        uVar3 = cstat[uVar11];
        if (uVar3 == 3) {
LAB_0012f0f2:
          piVar5[uVar11] = 0;
        }
        else if (uVar3 == 2) {
          piVar5[uVar11] = -1;
        }
        else {
          if (uVar3 != 0) {
            printf("Invalid basis status: col=%d, cstat=%d, lower=%g, upper=%g\n",pdVar6[uVar11],
                   pdVar7[uVar11],uVar11 & 0xffffffff,(ulong)uVar3);
            return (int)uVar11 + 1;
          }
          dVar2 = pdVar6[uVar11];
          pdVar1 = pdVar7 + uVar11;
          if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_0012f0f2;
          piVar5[uVar11] = 1;
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)this->numCol);
  }
  if (0 < this->numRow) {
    piVar4 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      iVar9 = this->numCol + (uint)uVar11;
      if (rstat[uVar11] == 1) {
        piVar4[iVar9] = 0;
        piVar5[iVar9] = 0;
        piVar8[iVar10] = iVar9;
        iVar10 = iVar10 + 1;
      }
      else {
        piVar4[iVar9] = 1;
        uVar3 = rstat[uVar11];
        if (uVar3 == 3) {
LAB_0012f1a5:
          piVar5[iVar9] = 0;
        }
        else if (uVar3 == 2) {
          piVar5[iVar9] = 1;
        }
        else {
          if (uVar3 != 0) {
            printf("Invalid basis status: row=%d, rstat=%d, lower=%g, upper=%g\n",pdVar6[uVar11],
                   pdVar7[uVar11],uVar11 & 0xffffffff,(ulong)uVar3);
            return ~(uint)uVar11;
          }
          dVar2 = pdVar6[uVar11];
          pdVar1 = pdVar7 + uVar11;
          if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_0012f1a5;
          piVar5[iVar9] = -1;
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)this->numRow);
  }
  populate_WorkArrays(this);
  mlFg_Update(this,this->mlFg_action_NewBasis);
  return 0;
}

Assistant:

int HModel::util_convertBaseStatToWorking(const int* cstat, const int* rstat) {
  int numBasic=0;
  for (int col = 0; col < numCol; col++) {
    int var = col;
    if (cstat[col] == HSOL_BASESTAT_BASIC) {
      nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      basicIndex[numBasic] = var;
      numBasic++;
      continue;
    }
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
    if (cstat[col] == HSOL_BASESTAT_LOWER) {
      //HSOL_BASESTAT_LOWER includes fixed variables
      if (colLower[col] == colUpper[col]) {
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
	continue;
      }
      else {
	nonbasicMove[var] = NONBASIC_MOVE_UP;
	continue;
      }
    }
    else if (cstat[col] == HSOL_BASESTAT_UPPER) {
      nonbasicMove[var] = NONBASIC_MOVE_DN;
      continue;
    }
    else if (cstat[col] == HSOL_BASESTAT_ZERO) {
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      continue;
    }
    else {
#ifdef JAJH_dev
      printf("Invalid basis status: col=%d, cstat=%d, lower=%g, upper=%g\n",
	     col, cstat[col], colLower[col], colUpper[col]);
#endif
      return col+1;
    }
  }
  for (int row = 0; row < numRow; row++) {
    int var = numCol + row;
    if (rstat[row] == HSOL_BASESTAT_BASIC) {
      nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      basicIndex[numBasic] = var;
      numBasic++;
      continue;
    }
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
    if (rstat[row] == HSOL_BASESTAT_LOWER) {
      //HSOL_BASESTAT_LOWER includes fixed variables
      if (rowLower[row] == rowUpper[row]) {
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
	continue;
      }
      else {
	nonbasicMove[var] = NONBASIC_MOVE_DN;
	continue;
      }
    }
    else if (rstat[row] == HSOL_BASESTAT_UPPER) {
      nonbasicMove[var] = NONBASIC_MOVE_UP;
      continue;}
    else if (rstat[row] == HSOL_BASESTAT_ZERO) {
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      continue;}
    else {
#ifdef JAJH_dev
      printf("Invalid basis status: row=%d, rstat=%d, lower=%g, upper=%g\n",
	     row, rstat[row], rowLower[row], rowUpper[row]);
#endif
      return -(row+1);}
      printf("convertBaseStatToWorking: row=%d, rstat=%d, lower=%g, upper=%g, nonbasicMove=%d\n",
	     row, rstat[row], rowLower[row], rowUpper[row], nonbasicMove[var]);
  }
  assert(numBasic=numRow);
  populate_WorkArrays();
  mlFg_Update(mlFg_action_NewBasis);
  return 0;
}